

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O3

void __thiscall xray_re::way_point_io::operator()(way_point_io *this,way_point *point,xr_writer *w)

{
  float local_1c;
  
  local_1c = (point->position).field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (point->position).field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (point->position).field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)point->flags;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::w_sz(w,&point->name);
  return;
}

Assistant:

void way_point_io::operator()(const way_point& point, xr_writer& w) const
{
	w.w_fvector3(point.position);
	w.w_u32(point.flags);
	w.w_sz(point.name);
}